

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O1

int wiz_show_rooms(void)

{
  nh_menuitem *pnVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  char cVar5;
  long lVar6;
  long lVar7;
  menulist menu;
  char row [81];
  menulist local_88;
  char local_78 [80];
  undefined1 local_28;
  
  init_menulist(&local_88);
  lVar6 = 0x46;
  lVar7 = 0;
  do {
    pcVar2 = level->levname + lVar6;
    lVar4 = 0;
    do {
      uVar3 = *(ushort *)(pcVar2 + 2) & 0x3f;
      if (uVar3 < 3) {
        cVar5 = (char)(0x2a2b2e >> ((byte)(uVar3 << 3) & 0x1f));
      }
      else {
        uVar3 = (uVar3 - 3) % 0x34;
        cVar5 = (uVar3 < 0x1a) * ' ' + (char)uVar3 + 'A';
      }
      local_78[lVar4] = cVar5;
      lVar4 = lVar4 + 1;
      pcVar2 = pcVar2 + 0xfc;
    } while (lVar4 != 0x50);
    local_28 = 0;
    lVar4 = (long)local_88.size;
    if (local_88.size <= local_88.icount) {
      local_88.size = local_88.size * 2;
      local_88.items = (nh_menuitem *)realloc(local_88.items,lVar4 * 0x218);
    }
    pnVar1 = local_88.items + local_88.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,local_78);
    local_88.icount = local_88.icount + 1;
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0xc;
  } while (lVar7 != 0x15);
  display_menu(local_88.items,local_88.icount,(char *)0x0,0,(int *)0x0);
  free(local_88.items);
  return 0;
}

Assistant:

static int wiz_show_rooms(void)
{
	struct menulist menu;
	int x, y;
	char row[COLNO+1];

	init_menulist(&menu);

	for (y = 0; y < ROWNO; y++) {
	    for (x = 0; x < COLNO; x++) {
		int rno = level->locations[x][y].roomno;
		if (rno == NO_ROOM) {
		    row[x] = '.';
		} else if (rno == SHARED) {
		    row[x] = '+';
		} else if (rno == SHARED_PLUS) {
		    row[x] = '*';
		} else {
		    int i = (rno - ROOMOFFSET) % 52;
		    row[x] = (i < 26) ? ('a' + i) : ('A' + i);
		}
	    }
	    row[COLNO] = '\0';
	    add_menutext(&menu, row);
	}
	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
	free(menu.items);
	return 0;
}